

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<int>::resizeRealloc<slang::SmallVectorBase<int>::ValueInitTag>
          (SmallVectorBase<int> *this,size_type newSize,ValueInitTag *val)

{
  ulong uVar1;
  pointer __src;
  size_type sVar2;
  pointer __dest;
  ulong uVar3;
  
  if (newSize >> 0x3d == 0) {
    uVar1 = this->cap;
    uVar3 = uVar1 * 2;
    if (uVar1 * 2 <= newSize) {
      uVar3 = newSize;
    }
    if (0x1fffffffffffffff - uVar1 < uVar1) {
      uVar3 = 0x1fffffffffffffff;
    }
    __dest = (pointer)operator_new(uVar3 * 4);
    __src = this->data_;
    sVar2 = this->len;
    if (sVar2 != 0) {
      memmove(__dest,__src,sVar2 * 4);
    }
    if (0 < (long)(newSize - sVar2)) {
      memset(__dest + sVar2,0,(newSize - sVar2) * 4);
    }
    if (__src != (pointer)this->firstElement) {
      operator_delete(__src);
    }
    this->len = newSize;
    this->cap = uVar3;
    this->data_ = __dest;
    return;
  }
  detail::throwLengthError();
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    SLANG_ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::ranges::uninitialized_fill_n(newData + len, ptrdiff_t(newSize - len), val);
    }
    else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
        std::ranges::uninitialized_default_construct_n(newData + len, ptrdiff_t(newSize - len));
    }
    else {
        std::ranges::uninitialized_value_construct_n(newData + len, ptrdiff_t(newSize - len));
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}